

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

int beta_binomial_cdf_inv(double cdf,double a,double b,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    iVar4 = -1;
    if (-1 < c) {
      iVar4 = c;
    }
    dVar5 = 0.0;
    iVar2 = c;
    iVar3 = -1;
    do {
      if (iVar4 == iVar3) {
        return c;
      }
      iVar1 = iVar3 + 1;
      dVar6 = r8_beta((double)iVar1 + a,(double)iVar2 + b);
      dVar7 = r8_beta((double)(iVar3 + 2),(double)(iVar2 + 1));
      dVar8 = r8_beta(a,b);
      dVar5 = dVar5 + dVar6 / (dVar8 * dVar7 * (double)(c + 1));
      iVar2 = iVar2 + -1;
      iVar3 = iVar1;
    } while (dVar5 < cdf);
    return iVar1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"BETA_BINOMIAL_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int beta_binomial_cdf_inv ( double cdf, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_BINOMIAL_CDF_INV inverts the Beta Binomial CDF.
//
//  Discussion:
//
//    A simple discrete approach is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input, int C, a parameter of the PDF.
//    0 <= C.
//
//    Output, int BETA_BINOMIAL_CDF_INV, the smallest X whose cumulative
//    density function is greater than or equal to CDF.
//
{
  double cum;
  double pdf;
  int x;
  int y;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BETA_BINOMIAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  cum = 0.0;

  for ( y = 0; y <= c; y++ )
  {
    pdf = r8_beta ( a + static_cast<double>(y ),
      b + static_cast<double>(c - y ) ) / ( static_cast<double>(c + 1 )
      * r8_beta ( static_cast<double>(y + 1 ),
      static_cast<double>(c - y + 1 ) ) * r8_beta ( a, b ) );

    cum = cum + pdf;

    if ( cdf <= cum )
    {
      x = y;
      return x;
    }

  }

  x = c;

  return x;
}